

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::argument_loader<std::vector<long,std::allocator<long>>&,long>::
load_impl_sequence<0ul,1ul>
          (argument_loader<std::vector<long,std::allocator<long>>&,long> *this,long call)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = list_caster<std::vector<long,_std::allocator<long>_>,_long>::load
                    ((list_caster<std::vector<long,_std::allocator<long>_>,_long> *)(this + 8),
                     (PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  bVar2 = type_caster<long,_void>::load
                    ((type_caster<long,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 8),
                     SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  return bVar2 && bVar1;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }